

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_memory.cpp
# Opt level: O0

void * gim_realloc(void *ptr,size_t oldsize,size_t newsize)

{
  void *pvVar1;
  void *in_RDX;
  void *in_RSI;
  size_t copysize;
  void *newptr;
  void *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pvVar1 = gim_alloc(in_stack_ffffffffffffffd0);
  if (in_RSI < in_RDX) {
    in_RDX = in_RSI;
  }
  gim_simd_memcpy(in_RDX,in_stack_ffffffffffffffc8,0x1dd4d2);
  gim_free((void *)0x1dd4dc);
  return pvVar1;
}

Assistant:

void * gim_realloc(void *ptr, size_t oldsize, size_t newsize)
{
 	void * newptr = gim_alloc(newsize);
    size_t copysize = oldsize<newsize?oldsize:newsize;
    gim_simd_memcpy(newptr,ptr,copysize);
    gim_free(ptr);
    return newptr;
}